

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_frame_unpack_headers_payload(nghttp2_headers *frame,uint8_t *payload)

{
  uint8_t *payload_local;
  nghttp2_headers *frame_local;
  
  if (((frame->hd).flags & 0x20) == 0) {
    nghttp2_priority_spec_default_init(&frame->pri_spec);
  }
  else {
    nghttp2_frame_unpack_priority_spec(&frame->pri_spec,payload);
  }
  frame->nva = (nghttp2_nv *)0x0;
  frame->nvlen = 0;
  return 0;
}

Assistant:

int nghttp2_frame_unpack_headers_payload(nghttp2_headers *frame,
                                         const uint8_t *payload) {
  if (frame->hd.flags & NGHTTP2_FLAG_PRIORITY) {
    nghttp2_frame_unpack_priority_spec(&frame->pri_spec, payload);
  } else {
    nghttp2_priority_spec_default_init(&frame->pri_spec);
  }

  frame->nva = NULL;
  frame->nvlen = 0;

  return 0;
}